

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

bool __thiscall doctest::detail::TestCase::operator<(TestCase *this,TestCase *other)

{
  int iVar1;
  String *in_RSI;
  String *in_RDI;
  int file_cmp;
  int name_cmp;
  String *this_00;
  bool local_1;
  
  if (*(int *)&in_RDI[1].field_0 == *(int *)&in_RSI[1].field_0) {
    this_00 = in_RDI;
    iVar1 = strcmp(*(char **)((long)&in_RDI[1].field_0 + 8),*(char **)((long)&in_RSI[1].field_0 + 8)
                  );
    if (iVar1 == 0) {
      iVar1 = String::compare(this_00,in_RSI,false);
      if (iVar1 == 0) {
        local_1 = *(int *)&in_RDI[4].field_0 < *(int *)&in_RSI[4].field_0;
      }
      else {
        local_1 = iVar1 < 0;
      }
    }
    else {
      local_1 = iVar1 < 0;
    }
  }
  else {
    local_1 = *(uint *)&in_RDI[1].field_0 < *(uint *)&in_RSI[1].field_0;
  }
  return local_1;
}

Assistant:

bool TestCase::operator<(const TestCase& other) const {
        // this will be used only to differentiate between test cases - not relevant for sorting
        if(m_line != other.m_line)
            return m_line < other.m_line;
        const int name_cmp = strcmp(m_name, other.m_name);
        if(name_cmp != 0)
            return name_cmp < 0;
        const int file_cmp = m_file.compare(other.m_file);
        if(file_cmp != 0)
            return file_cmp < 0;
        return m_template_id < other.m_template_id;
    }